

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.cc
# Opt level: O2

ostream * operator<<(ostream *os,JournalOperation *opj)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(os,"Operation: ");
  poVar1 = std::operator<<(poVar1,(string *)opj);
  poVar1 = std::operator<<(poVar1," applied on ");
  pcVar2 = ctime(&opj->timestamp);
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(os,"Tool: ");
  poVar1 = std::operator<<(poVar1,(string *)&opj->tool);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"Details: ");
  poVar1 = std::operator<<(poVar1,(string *)&opj->detail);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const JournalOperation &opj) {
    os << "Operation: " << opj.name << " applied on " << ctime(&opj.timestamp);
    os << "Tool: " << opj.tool << std::endl;
    os << "Details: " << opj.detail << std::endl << std::endl;
    return os;
}